

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O0

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  float *pfVar7;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  __m128 _sum;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  float *r2;
  float *r1;
  float *r0;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  Mat img0;
  float *outptr0;
  int q;
  float *k0;
  float bias0;
  Mat out0;
  int p;
  int remain_outch_start;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  __m128 x32;
  __m128 x64;
  __m256 s0123;
  __m256 s23;
  __m256 s01;
  __m256 v3;
  float in_stack_fffffffffffff134;
  float in_stack_fffffffffffff138;
  float in_stack_fffffffffffff13c;
  float in_stack_fffffffffffff14c;
  float in_stack_fffffffffffff150;
  float in_stack_fffffffffffff154;
  float local_d94;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  int local_be4;
  float *local_be0;
  float *local_bd8;
  float *local_bd0;
  int local_bc4;
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  Mat local_aa0;
  float *local_a58;
  int local_a4c;
  Mat local_a48;
  float *local_a00;
  float local_9e4;
  Mat local_9e0;
  int local_998;
  undefined4 local_994;
  float *local_990;
  int local_988;
  int local_984;
  int local_980;
  int local_97c;
  float *local_950;
  float *local_948;
  float *local_940;
  float *local_938;
  float *local_930;
  float *local_928;
  float *local_920;
  float *local_918;
  float *local_910;
  undefined1 (*local_908) [32];
  float *local_900;
  float *local_8f8;
  float *local_8f0;
  float *local_8e8;
  float *local_8e0;
  float *local_8d8;
  float *local_8d0;
  float *local_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  ulong local_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined4 local_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined1 local_50 [16];
  ulong local_40;
  undefined8 uStack_38;
  
  local_97c = *(int *)(in_RDI + 0x38);
  local_980 = *(int *)(in_RSI + 0x2c);
  local_984 = *(int *)(in_RSI + 0x30);
  local_988 = *(int *)(in_RSI + 0x38);
  local_990 = Mat::operator_cast_to_float_(in_RCX);
  local_994 = 0;
  for (local_998 = 0; local_998 < local_988; local_998 = local_998 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                 (int)in_stack_fffffffffffff14c);
    if (local_990 == (float *)0x0) {
      local_d94 = 0.0;
    }
    else {
      local_d94 = local_990[local_998];
    }
    local_9e4 = local_d94;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138),
              in_stack_fffffffffffff134);
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                 (int)in_stack_fffffffffffff14c);
    pfVar7 = Mat::operator_cast_to_float_(&local_a48);
    Mat::~Mat((Mat *)0x330473);
    local_a00 = pfVar7;
    for (local_a4c = 0; local_a4c < local_97c; local_a4c = local_a4c + 1) {
      local_a58 = Mat::row(&local_9e0,0);
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                   (int)in_stack_fffffffffffff14c);
      local_8c8 = local_a00;
      local_ac0 = *(undefined8 *)local_a00;
      uStack_ab8 = *(undefined8 *)(local_a00 + 2);
      uStack_ab0 = *(undefined8 *)(local_a00 + 4);
      uStack_aa8 = *(undefined8 *)(local_a00 + 6);
      local_8d0 = local_a00 + 8;
      local_ae0 = *(undefined8 *)local_8d0;
      uStack_ad8 = *(undefined8 *)(local_a00 + 10);
      uStack_ad0 = *(undefined8 *)(local_a00 + 0xc);
      uStack_ac8 = *(undefined8 *)(local_a00 + 0xe);
      local_8d8 = local_a00 + 0x10;
      local_b00 = *(undefined8 *)local_8d8;
      uStack_af8 = *(undefined8 *)(local_a00 + 0x12);
      uStack_af0 = *(undefined8 *)(local_a00 + 0x14);
      uStack_ae8 = *(undefined8 *)(local_a00 + 0x16);
      local_8e0 = local_a00 + 0x18;
      local_b20 = *(undefined8 *)local_8e0;
      uStack_b18 = *(undefined8 *)(local_a00 + 0x1a);
      uStack_b10 = *(undefined8 *)(local_a00 + 0x1c);
      uStack_b08 = *(undefined8 *)(local_a00 + 0x1e);
      local_8e8 = local_a00 + 0x20;
      local_b40 = *(undefined8 *)local_8e8;
      uStack_b38 = *(undefined8 *)(local_a00 + 0x22);
      uStack_b30 = *(undefined8 *)(local_a00 + 0x24);
      uStack_b28 = *(undefined8 *)(local_a00 + 0x26);
      local_8f0 = local_a00 + 0x28;
      local_b60 = *(undefined8 *)local_8f0;
      uStack_b58 = *(undefined8 *)(local_a00 + 0x2a);
      uStack_b50 = *(undefined8 *)(local_a00 + 0x2c);
      uStack_b48 = *(undefined8 *)(local_a00 + 0x2e);
      local_8f8 = local_a00 + 0x30;
      local_b80 = *(undefined8 *)local_8f8;
      uStack_b78 = *(undefined8 *)(local_a00 + 0x32);
      uStack_b70 = *(undefined8 *)(local_a00 + 0x34);
      uStack_b68 = *(undefined8 *)(local_a00 + 0x36);
      local_900 = local_a00 + 0x38;
      local_ba0 = *(undefined8 *)local_900;
      uStack_b98 = *(undefined8 *)(local_a00 + 0x3a);
      uStack_b90 = *(undefined8 *)(local_a00 + 0x3c);
      uStack_b88 = *(undefined8 *)(local_a00 + 0x3e);
      local_908 = (undefined1 (*) [32])(local_a00 + 0x40);
      local_bc0 = *local_908;
      for (local_bc4 = 0; local_bc4 < local_984; local_bc4 = local_bc4 + 1) {
        local_bd0 = Mat::row(&local_aa0,local_bc4);
        local_bd8 = Mat::row(&local_aa0,local_bc4 + 1);
        local_be0 = Mat::row(&local_aa0,local_bc4 + 2);
        for (local_be4 = 0; local_be4 < local_980; local_be4 = local_be4 + 1) {
          local_910 = local_bd0;
          local_c20 = *(undefined8 *)local_bd0;
          uStack_c18 = *(undefined8 *)(local_bd0 + 2);
          uStack_c10 = *(undefined8 *)(local_bd0 + 4);
          uStack_c08 = *(undefined8 *)(local_bd0 + 6);
          local_918 = local_bd0 + 8;
          local_c40 = *(undefined8 *)local_918;
          uStack_c38 = *(undefined8 *)(local_bd0 + 10);
          uStack_c30 = *(undefined8 *)(local_bd0 + 0xc);
          uStack_c28 = *(undefined8 *)(local_bd0 + 0xe);
          local_920 = local_bd0 + 0x10;
          local_c60 = *(undefined8 *)local_920;
          uStack_c58 = *(undefined8 *)(local_bd0 + 0x12);
          uStack_c50 = *(undefined8 *)(local_bd0 + 0x14);
          uStack_c48 = *(undefined8 *)(local_bd0 + 0x16);
          local_460._0_4_ = (float)local_ac0;
          local_460._4_4_ = (float)((ulong)local_ac0 >> 0x20);
          uStack_458._0_4_ = (float)uStack_ab8;
          uStack_458._4_4_ = (float)((ulong)uStack_ab8 >> 0x20);
          uStack_450._0_4_ = (float)uStack_ab0;
          uStack_450._4_4_ = (float)((ulong)uStack_ab0 >> 0x20);
          uStack_448._0_4_ = (float)uStack_aa8;
          uStack_448._4_4_ = (float)((ulong)uStack_aa8 >> 0x20);
          local_480._0_4_ = (float)local_c20;
          local_480._4_4_ = (float)((ulong)local_c20 >> 0x20);
          uStack_478._0_4_ = (float)uStack_c18;
          uStack_478._4_4_ = (float)((ulong)uStack_c18 >> 0x20);
          uStack_470._0_4_ = (float)uStack_c10;
          uStack_470._4_4_ = (float)((ulong)uStack_c10 >> 0x20);
          uStack_468._0_4_ = (float)uStack_c08;
          local_6e0 = CONCAT44(local_460._4_4_ * local_480._4_4_,(float)local_460 * (float)local_480
                              );
          uStack_6d8 = CONCAT44(uStack_458._4_4_ * uStack_478._4_4_,
                                (float)uStack_458 * (float)uStack_478);
          uStack_6d0 = CONCAT44(uStack_450._4_4_ * uStack_470._4_4_,
                                (float)uStack_450 * (float)uStack_470);
          uStack_6c8 = CONCAT44(uStack_448._4_4_,(float)uStack_448 * (float)uStack_468);
          local_4a0._0_4_ = (float)local_ae0;
          local_4a0._4_4_ = (float)((ulong)local_ae0 >> 0x20);
          uStack_498._0_4_ = (float)uStack_ad8;
          uStack_498._4_4_ = (float)((ulong)uStack_ad8 >> 0x20);
          uStack_490._0_4_ = (float)uStack_ad0;
          uStack_490._4_4_ = (float)((ulong)uStack_ad0 >> 0x20);
          uStack_488._0_4_ = (float)uStack_ac8;
          uStack_488._4_4_ = (float)((ulong)uStack_ac8 >> 0x20);
          local_4c0._0_4_ = (float)local_c40;
          local_4c0._4_4_ = (float)((ulong)local_c40 >> 0x20);
          uStack_4b8._0_4_ = (float)uStack_c38;
          uStack_4b8._4_4_ = (float)((ulong)uStack_c38 >> 0x20);
          uStack_4b0._0_4_ = (float)uStack_c30;
          uStack_4b0._4_4_ = (float)((ulong)uStack_c30 >> 0x20);
          uStack_4a8._0_4_ = (float)uStack_c28;
          local_740 = CONCAT44(local_4a0._4_4_ * local_4c0._4_4_,(float)local_4a0 * (float)local_4c0
                              );
          uStack_738 = CONCAT44(uStack_498._4_4_ * uStack_4b8._4_4_,
                                (float)uStack_498 * (float)uStack_4b8);
          uStack_730 = CONCAT44(uStack_490._4_4_ * uStack_4b0._4_4_,
                                (float)uStack_490 * (float)uStack_4b0);
          uStack_728 = CONCAT44(uStack_488._4_4_,(float)uStack_488 * (float)uStack_4a8);
          local_4e0._0_4_ = (float)local_b00;
          local_4e0._4_4_ = (float)((ulong)local_b00 >> 0x20);
          uStack_4d8._0_4_ = (float)uStack_af8;
          uStack_4d8._4_4_ = (float)((ulong)uStack_af8 >> 0x20);
          uStack_4d0._0_4_ = (float)uStack_af0;
          uStack_4d0._4_4_ = (float)((ulong)uStack_af0 >> 0x20);
          uStack_4c8._0_4_ = (float)uStack_ae8;
          uStack_4c8._4_4_ = (float)((ulong)uStack_ae8 >> 0x20);
          local_500._0_4_ = (float)local_c60;
          local_500._4_4_ = (float)((ulong)local_c60 >> 0x20);
          uStack_4f8._0_4_ = (float)uStack_c58;
          uStack_4f8._4_4_ = (float)((ulong)uStack_c58 >> 0x20);
          uStack_4f0._0_4_ = (float)uStack_c50;
          uStack_4f0._4_4_ = (float)((ulong)uStack_c50 >> 0x20);
          uStack_4e8._0_4_ = (float)uStack_c48;
          local_7a0 = CONCAT44(local_4e0._4_4_ * local_500._4_4_,(float)local_4e0 * (float)local_500
                              );
          uStack_798 = CONCAT44(uStack_4d8._4_4_ * uStack_4f8._4_4_,
                                (float)uStack_4d8 * (float)uStack_4f8);
          uStack_790 = CONCAT44(uStack_4d0._4_4_ * uStack_4f0._4_4_,
                                (float)uStack_4d0 * (float)uStack_4f0);
          uStack_788 = CONCAT44(uStack_4c8._4_4_,(float)uStack_4c8 * (float)uStack_4e8);
          local_928 = local_bd8;
          local_6c0 = *(undefined8 *)local_bd8;
          uStack_6b8 = *(undefined8 *)(local_bd8 + 2);
          uStack_6b0 = *(undefined8 *)(local_bd8 + 4);
          uStack_6a8 = *(undefined8 *)(local_bd8 + 6);
          local_930 = local_bd8 + 8;
          local_720 = *(undefined8 *)local_930;
          uStack_718 = *(undefined8 *)(local_bd8 + 10);
          uStack_710 = *(undefined8 *)(local_bd8 + 0xc);
          uStack_708 = *(undefined8 *)(local_bd8 + 0xe);
          local_938 = local_bd8 + 0x10;
          local_780 = *(undefined8 *)local_938;
          uStack_778 = *(undefined8 *)(local_bd8 + 0x12);
          uStack_770 = *(undefined8 *)(local_bd8 + 0x14);
          uStack_768 = *(undefined8 *)(local_bd8 + 0x16);
          local_6a0._0_4_ = (float)local_b20;
          local_660 = (float)local_6a0;
          local_6a0._4_4_ = (float)((ulong)local_b20 >> 0x20);
          fStack_65c = local_6a0._4_4_;
          uStack_698._0_4_ = (float)uStack_b18;
          fStack_658 = (float)uStack_698;
          uStack_698._4_4_ = (float)((ulong)uStack_b18 >> 0x20);
          fStack_654 = uStack_698._4_4_;
          uStack_690._0_4_ = (float)uStack_b10;
          fStack_650 = (float)uStack_690;
          uStack_690._4_4_ = (float)((ulong)uStack_b10 >> 0x20);
          fStack_64c = uStack_690._4_4_;
          uStack_688._0_4_ = (float)uStack_b08;
          fStack_648 = (float)uStack_688;
          uStack_688._4_4_ = (float)((ulong)uStack_b08 >> 0x20);
          fStack_644 = uStack_688._4_4_;
          local_680._0_4_ = (float)local_6c0;
          local_680._4_4_ = (float)((ulong)local_6c0 >> 0x20);
          uStack_678._0_4_ = (float)uStack_6b8;
          uStack_678._4_4_ = (float)((ulong)uStack_6b8 >> 0x20);
          uStack_670._0_4_ = (float)uStack_6b0;
          uStack_670._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
          uStack_668._0_4_ = (float)uStack_6a8;
          local_420 = (float)local_6a0 * (float)local_680;
          fStack_41c = local_6a0._4_4_ * local_680._4_4_;
          fStack_418 = (float)uStack_698 * (float)uStack_678;
          fStack_414 = uStack_698._4_4_ * uStack_678._4_4_;
          fStack_410 = (float)uStack_690 * (float)uStack_670;
          fStack_40c = uStack_690._4_4_ * uStack_670._4_4_;
          fStack_408 = (float)uStack_688 * (float)uStack_668;
          fVar8 = local_420 + (float)local_460 * (float)local_480;
          fVar11 = fStack_41c + local_460._4_4_ * local_480._4_4_;
          fVar14 = fStack_418 + (float)uStack_458 * (float)uStack_478;
          fVar17 = fStack_414 + uStack_458._4_4_ * uStack_478._4_4_;
          fVar19 = fStack_410 + (float)uStack_450 * (float)uStack_470;
          fVar21 = fStack_40c + uStack_450._4_4_ * uStack_470._4_4_;
          fVar23 = fStack_408 + (float)uStack_448 * (float)uStack_468;
          local_800 = CONCAT44(fVar11,fVar8);
          uStack_7f8 = CONCAT44(fVar17,fVar14);
          uStack_7f0 = CONCAT44(fVar21,fVar19);
          uStack_7e8 = CONCAT44(uStack_688._4_4_ + uStack_448._4_4_,fVar23);
          local_700._0_4_ = (float)local_b40;
          local_620 = (float)local_700;
          local_700._4_4_ = (float)((ulong)local_b40 >> 0x20);
          fStack_61c = local_700._4_4_;
          uStack_6f8._0_4_ = (float)uStack_b38;
          fStack_618 = (float)uStack_6f8;
          uStack_6f8._4_4_ = (float)((ulong)uStack_b38 >> 0x20);
          fStack_614 = uStack_6f8._4_4_;
          uStack_6f0._0_4_ = (float)uStack_b30;
          fStack_610 = (float)uStack_6f0;
          uStack_6f0._4_4_ = (float)((ulong)uStack_b30 >> 0x20);
          fStack_60c = uStack_6f0._4_4_;
          uStack_6e8._0_4_ = (float)uStack_b28;
          fStack_608 = (float)uStack_6e8;
          uStack_6e8._4_4_ = (float)((ulong)uStack_b28 >> 0x20);
          fStack_604 = uStack_6e8._4_4_;
          local_640._0_4_ = (float)local_720;
          local_640._4_4_ = (float)((ulong)local_720 >> 0x20);
          uStack_638._0_4_ = (float)uStack_718;
          uStack_638._4_4_ = (float)((ulong)uStack_718 >> 0x20);
          uStack_630._0_4_ = (float)uStack_710;
          uStack_630._4_4_ = (float)((ulong)uStack_710 >> 0x20);
          uStack_628._0_4_ = (float)uStack_708;
          local_3e0 = (float)local_700 * (float)local_640;
          fStack_3dc = local_700._4_4_ * local_640._4_4_;
          fStack_3d8 = (float)uStack_6f8 * (float)uStack_638;
          fStack_3d4 = uStack_6f8._4_4_ * uStack_638._4_4_;
          fStack_3d0 = (float)uStack_6f0 * (float)uStack_630;
          fStack_3cc = uStack_6f0._4_4_ * uStack_630._4_4_;
          fStack_3c8 = (float)uStack_6e8 * (float)uStack_628;
          fVar9 = local_3e0 + (float)local_4a0 * (float)local_4c0;
          fVar12 = fStack_3dc + local_4a0._4_4_ * local_4c0._4_4_;
          fVar15 = fStack_3d8 + (float)uStack_498 * (float)uStack_4b8;
          fVar18 = fStack_3d4 + uStack_498._4_4_ * uStack_4b8._4_4_;
          fVar20 = fStack_3d0 + (float)uStack_490 * (float)uStack_4b0;
          fVar22 = fStack_3cc + uStack_490._4_4_ * uStack_4b0._4_4_;
          fVar24 = fStack_3c8 + (float)uStack_488 * (float)uStack_4a8;
          local_860 = CONCAT44(fVar12,fVar9);
          uStack_858 = CONCAT44(fVar18,fVar15);
          uStack_850 = CONCAT44(fVar22,fVar20);
          uStack_848 = CONCAT44(uStack_6e8._4_4_ + uStack_488._4_4_,fVar24);
          local_760._0_4_ = (float)local_b60;
          local_5e0 = (float)local_760;
          local_760._4_4_ = (float)((ulong)local_b60 >> 0x20);
          fStack_5dc = local_760._4_4_;
          uStack_758._0_4_ = (float)uStack_b58;
          fStack_5d8 = (float)uStack_758;
          uStack_758._4_4_ = (float)((ulong)uStack_b58 >> 0x20);
          fStack_5d4 = uStack_758._4_4_;
          uStack_750._0_4_ = (float)uStack_b50;
          fStack_5d0 = (float)uStack_750;
          uStack_750._4_4_ = (float)((ulong)uStack_b50 >> 0x20);
          fStack_5cc = uStack_750._4_4_;
          uStack_748._0_4_ = (float)uStack_b48;
          fStack_5c8 = (float)uStack_748;
          uStack_748._4_4_ = (float)((ulong)uStack_b48 >> 0x20);
          fStack_5c4 = uStack_748._4_4_;
          local_600._0_4_ = (float)local_780;
          local_600._4_4_ = (float)((ulong)local_780 >> 0x20);
          uStack_5f8._0_4_ = (float)uStack_778;
          uStack_5f8._4_4_ = (float)((ulong)uStack_778 >> 0x20);
          uStack_5f0._0_4_ = (float)uStack_770;
          uStack_5f0._4_4_ = (float)((ulong)uStack_770 >> 0x20);
          uStack_5e8._0_4_ = (float)uStack_768;
          local_3a0 = (float)local_760 * (float)local_600;
          fStack_39c = local_760._4_4_ * local_600._4_4_;
          fStack_398 = (float)uStack_758 * (float)uStack_5f8;
          fStack_394 = uStack_758._4_4_ * uStack_5f8._4_4_;
          fStack_390 = (float)uStack_750 * (float)uStack_5f0;
          fStack_38c = uStack_750._4_4_ * uStack_5f0._4_4_;
          fStack_388 = (float)uStack_748 * (float)uStack_5e8;
          fVar10 = local_3a0 + (float)local_4e0 * (float)local_500;
          fVar13 = fStack_39c + local_4e0._4_4_ * local_500._4_4_;
          fVar16 = fStack_398 + (float)uStack_4d8 * (float)uStack_4f8;
          in_stack_fffffffffffff14c = fStack_394 + uStack_4d8._4_4_ * uStack_4f8._4_4_;
          in_stack_fffffffffffff150 = fStack_390 + (float)uStack_4d0 * (float)uStack_4f0;
          in_stack_fffffffffffff154 = fStack_38c + uStack_4d0._4_4_ * uStack_4f0._4_4_;
          fVar25 = fStack_388 + (float)uStack_4c8 * (float)uStack_4e8;
          local_8c0 = CONCAT44(fVar13,fVar10);
          uStack_8b8 = CONCAT44(in_stack_fffffffffffff14c,fVar16);
          uStack_8b0 = CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150);
          uStack_8a8 = CONCAT44(uStack_748._4_4_ + uStack_4c8._4_4_,fVar25);
          local_940 = local_be0;
          local_7e0 = *(undefined8 *)local_be0;
          uStack_7d8 = *(undefined8 *)(local_be0 + 2);
          uStack_7d0 = *(undefined8 *)(local_be0 + 4);
          uStack_7c8 = *(undefined8 *)(local_be0 + 6);
          local_948 = local_be0 + 8;
          local_840 = *(undefined8 *)local_948;
          uStack_838 = *(undefined8 *)(local_be0 + 10);
          uStack_830 = *(undefined8 *)(local_be0 + 0xc);
          uStack_828 = *(undefined8 *)(local_be0 + 0xe);
          local_950 = local_be0 + 0x10;
          local_8a0 = *(undefined8 *)local_950;
          uStack_898 = *(undefined8 *)(local_be0 + 0x12);
          uStack_890 = *(undefined8 *)(local_be0 + 0x14);
          uStack_888 = *(undefined8 *)(local_be0 + 0x16);
          local_7c0._0_4_ = (float)local_b80;
          local_5a0 = (float)local_7c0;
          local_7c0._4_4_ = (float)((ulong)local_b80 >> 0x20);
          fStack_59c = local_7c0._4_4_;
          uStack_7b8._0_4_ = (float)uStack_b78;
          fStack_598 = (float)uStack_7b8;
          uStack_7b8._4_4_ = (float)((ulong)uStack_b78 >> 0x20);
          fStack_594 = uStack_7b8._4_4_;
          uStack_7b0._0_4_ = (float)uStack_b70;
          fStack_590 = (float)uStack_7b0;
          uStack_7b0._4_4_ = (float)((ulong)uStack_b70 >> 0x20);
          fStack_58c = uStack_7b0._4_4_;
          uStack_7a8._0_4_ = (float)uStack_b68;
          fStack_588 = (float)uStack_7a8;
          uStack_7a8._4_4_ = (float)((ulong)uStack_b68 >> 0x20);
          fStack_584 = uStack_7a8._4_4_;
          local_5c0._0_4_ = (float)local_7e0;
          local_5c0._4_4_ = (float)((ulong)local_7e0 >> 0x20);
          uStack_5b8._0_4_ = (float)uStack_7d8;
          uStack_5b8._4_4_ = (float)((ulong)uStack_7d8 >> 0x20);
          uStack_5b0._0_4_ = (float)uStack_7d0;
          uStack_5b0._4_4_ = (float)((ulong)uStack_7d0 >> 0x20);
          uStack_5a8._0_4_ = (float)uStack_7c8;
          local_360 = (float)local_7c0 * (float)local_5c0;
          fStack_35c = local_7c0._4_4_ * local_5c0._4_4_;
          fStack_358 = (float)uStack_7b8 * (float)uStack_5b8;
          fStack_354 = uStack_7b8._4_4_ * uStack_5b8._4_4_;
          fStack_350 = (float)uStack_7b0 * (float)uStack_5b0;
          fStack_34c = uStack_7b0._4_4_ * uStack_5b0._4_4_;
          fStack_348 = (float)uStack_7a8 * (float)uStack_5a8;
          local_c80 = CONCAT44(fStack_35c + fVar11,local_360 + fVar8);
          uStack_c78 = CONCAT44(fStack_354 + fVar17,fStack_358 + fVar14);
          uStack_c70 = CONCAT44(fStack_34c + fVar21,fStack_350 + fVar19);
          uStack_c68 = CONCAT44(uStack_7a8._4_4_ + uStack_688._4_4_ + uStack_448._4_4_,
                                fStack_348 + fVar23);
          local_820._0_4_ = (float)local_ba0;
          local_560 = (float)local_820;
          local_820._4_4_ = (float)((ulong)local_ba0 >> 0x20);
          fStack_55c = local_820._4_4_;
          uStack_818._0_4_ = (float)uStack_b98;
          fStack_558 = (float)uStack_818;
          uStack_818._4_4_ = (float)((ulong)uStack_b98 >> 0x20);
          fStack_554 = uStack_818._4_4_;
          uStack_810._0_4_ = (float)uStack_b90;
          fStack_550 = (float)uStack_810;
          uStack_810._4_4_ = (float)((ulong)uStack_b90 >> 0x20);
          fStack_54c = uStack_810._4_4_;
          uStack_808._0_4_ = (float)uStack_b88;
          fStack_548 = (float)uStack_808;
          uStack_808._4_4_ = (float)((ulong)uStack_b88 >> 0x20);
          fStack_544 = uStack_808._4_4_;
          local_580._0_4_ = (float)local_840;
          local_580._4_4_ = (float)((ulong)local_840 >> 0x20);
          uStack_578._0_4_ = (float)uStack_838;
          uStack_578._4_4_ = (float)((ulong)uStack_838 >> 0x20);
          uStack_570._0_4_ = (float)uStack_830;
          uStack_570._4_4_ = (float)((ulong)uStack_830 >> 0x20);
          uStack_568._0_4_ = (float)uStack_828;
          local_320 = (float)local_820 * (float)local_580;
          fStack_31c = local_820._4_4_ * local_580._4_4_;
          fStack_318 = (float)uStack_818 * (float)uStack_578;
          fStack_314 = uStack_818._4_4_ * uStack_578._4_4_;
          fStack_310 = (float)uStack_810 * (float)uStack_570;
          fStack_30c = uStack_810._4_4_ * uStack_570._4_4_;
          fStack_308 = (float)uStack_808 * (float)uStack_568;
          local_ca0 = CONCAT44(fStack_31c + fVar12,local_320 + fVar9);
          uStack_c98 = CONCAT44(fStack_314 + fVar18,fStack_318 + fVar15);
          uStack_c90 = CONCAT44(fStack_30c + fVar22,fStack_310 + fVar20);
          uStack_c88 = CONCAT44(uStack_808._4_4_ + uStack_6e8._4_4_ + uStack_488._4_4_,
                                fStack_308 + fVar24);
          local_880._0_4_ = local_bc0._0_4_;
          local_520 = (float)local_880;
          local_880._4_4_ = local_bc0._4_4_;
          fStack_51c = local_880._4_4_;
          uStack_878._0_4_ = local_bc0._8_4_;
          fStack_518 = (float)uStack_878;
          uStack_878._4_4_ = local_bc0._12_4_;
          fStack_514 = uStack_878._4_4_;
          uStack_870._0_4_ = local_bc0._16_4_;
          fStack_510 = (float)uStack_870;
          uStack_870._4_4_ = local_bc0._20_4_;
          fStack_50c = uStack_870._4_4_;
          uStack_868._0_4_ = local_bc0._24_4_;
          fStack_508 = (float)uStack_868;
          uStack_868._4_4_ = local_bc0._28_4_;
          fStack_504 = uStack_868._4_4_;
          local_540._0_4_ = (float)local_8a0;
          local_540._4_4_ = (float)((ulong)local_8a0 >> 0x20);
          uStack_538._0_4_ = (float)uStack_898;
          uStack_538._4_4_ = (float)((ulong)uStack_898 >> 0x20);
          uStack_530._0_4_ = (float)uStack_890;
          uStack_530._4_4_ = (float)((ulong)uStack_890 >> 0x20);
          uStack_528._0_4_ = (float)uStack_888;
          local_2e0 = (float)local_880 * (float)local_540;
          fStack_2dc = local_880._4_4_ * local_540._4_4_;
          fStack_2d8 = (float)uStack_878 * (float)uStack_538;
          fStack_2d4 = uStack_878._4_4_ * uStack_538._4_4_;
          fStack_2d0 = (float)uStack_870 * (float)uStack_530;
          fStack_2cc = uStack_870._4_4_ * uStack_530._4_4_;
          fStack_2c8 = (float)uStack_868 * (float)uStack_528;
          in_stack_fffffffffffff14c = fStack_2d4 + in_stack_fffffffffffff14c;
          in_stack_fffffffffffff150 = fStack_2d0 + in_stack_fffffffffffff150;
          in_stack_fffffffffffff154 = fStack_2cc + in_stack_fffffffffffff154;
          local_cc0 = CONCAT44(fStack_2dc + fVar13,local_2e0 + fVar10);
          uStack_cb8 = CONCAT44(in_stack_fffffffffffff14c,fStack_2d8 + fVar16);
          uStack_cb0 = CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150);
          uStack_ca8 = CONCAT44(uStack_868._4_4_ + uStack_748._4_4_ + uStack_4c8._4_4_,
                                fStack_2c8 + fVar25);
          local_1d0 = &local_c80;
          local_1d8 = &local_ca0;
          local_1e0 = &local_cc0;
          local_1c4 = 0;
          local_180 = 0;
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          local_1a0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          auStack_190 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          local_200 = local_1a0._0_8_;
          uStack_1f8 = local_1a0._8_8_;
          uStack_1f0 = auStack_190._0_8_;
          uStack_1e8 = auStack_190._8_8_;
          auVar6._8_8_ = uStack_c78;
          auVar6._0_8_ = local_c80;
          auVar6._16_8_ = uStack_c70;
          auVar6._24_8_ = uStack_c68;
          auVar5._8_8_ = uStack_c98;
          auVar5._0_8_ = local_ca0;
          auVar5._16_8_ = uStack_c90;
          auVar5._24_8_ = uStack_c88;
          local_220 = vhaddps_avx(auVar6,auVar5);
          auVar4._8_8_ = uStack_cb8;
          auVar4._0_8_ = local_cc0;
          auVar4._16_8_ = uStack_cb0;
          auVar4._24_8_ = uStack_ca8;
          local_120 = local_1a0._0_8_;
          uStack_118 = local_1a0._8_8_;
          uStack_110 = auStack_190._0_8_;
          uStack_108 = auStack_190._8_8_;
          auVar2._16_8_ = auStack_190._0_8_;
          auVar2._0_16_ = local_1a0;
          auVar2._24_8_ = auStack_190._8_8_;
          local_240 = vhaddps_avx(auVar4,auVar2);
          local_140 = local_220._0_8_;
          uStack_138 = local_220._8_8_;
          uStack_130 = local_220._16_8_;
          uStack_128 = local_220._24_8_;
          local_160 = local_240._0_8_;
          uStack_158 = local_240._8_8_;
          uStack_150 = local_240._16_8_;
          uStack_148 = local_240._24_8_;
          local_260 = vhaddps_avx(local_220,local_240);
          local_a0 = local_260._0_8_;
          uStack_98 = local_260._8_8_;
          uStack_90 = local_260._16_8_;
          uStack_88 = local_260._24_8_;
          local_1b0._0_4_ = local_260._16_4_;
          local_1b0._4_4_ = local_260._20_4_;
          uStack_1a8._0_4_ = local_260._24_4_;
          uStack_1a8._4_4_ = local_260._28_4_;
          local_1c0._0_4_ = local_260._0_4_;
          local_1c0._4_4_ = local_260._4_4_;
          uStack_1b8._0_4_ = local_260._8_4_;
          uStack_1b8._4_4_ = local_260._12_4_;
          in_stack_fffffffffffff134 = local_1b0._4_4_ + local_1c0._4_4_;
          in_stack_fffffffffffff138 = (float)uStack_1a8 + (float)uStack_1b8;
          in_stack_fffffffffffff13c = uStack_1a8._4_4_ + uStack_1b8._4_4_;
          local_290 = CONCAT44(in_stack_fffffffffffff134,(float)local_1b0 + (float)local_1c0);
          uStack_288 = CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138);
          auVar3._8_8_ = uStack_288;
          auVar3._0_8_ = local_290;
          auVar1._8_8_ = uStack_288;
          auVar1._0_8_ = local_290;
          _local_280 = vunpckhpd_avx(auVar1,auVar3);
          local_2a0 = (float)local_1b0 + (float)local_1c0 + (float)local_280._0_4_;
          fStack_29c = in_stack_fffffffffffff134 + (float)local_280._4_4_;
          fStack_298 = in_stack_fffffffffffff138 + fStack_278;
          fStack_294 = in_stack_fffffffffffff13c + fStack_274;
          local_50._0_4_ = local_2a0 + fStack_29c;
          local_50._4_4_ = 0;
          local_2b0 = local_50._0_8_;
          uStack_2a8 = 0;
          local_40 = local_50._0_8_;
          uStack_38 = 0;
          *local_a58 = (float)local_50._0_4_ + *local_a58;
          local_a58 = local_a58 + 1;
          local_bd0 = local_bd0 + 8;
          local_bd8 = local_bd8 + 8;
          local_be0 = local_be0 + 8;
          local_880 = local_bc0._0_8_;
          uStack_878 = local_bc0._8_8_;
          uStack_870 = local_bc0._16_8_;
          uStack_868 = local_bc0._24_8_;
          local_820 = local_ba0;
          uStack_818 = uStack_b98;
          uStack_810 = uStack_b90;
          uStack_808 = uStack_b88;
          local_7c0 = local_b80;
          uStack_7b8 = uStack_b78;
          uStack_7b0 = uStack_b70;
          uStack_7a8 = uStack_b68;
          local_760 = local_b60;
          uStack_758 = uStack_b58;
          uStack_750 = uStack_b50;
          uStack_748 = uStack_b48;
          local_700 = local_b40;
          uStack_6f8 = uStack_b38;
          uStack_6f0 = uStack_b30;
          uStack_6e8 = uStack_b28;
          local_6a0 = local_b20;
          uStack_698 = uStack_b18;
          uStack_690 = uStack_b10;
          uStack_688 = uStack_b08;
          local_680 = local_6c0;
          uStack_678 = uStack_6b8;
          uStack_670 = uStack_6b0;
          uStack_668 = uStack_6a8;
          local_640 = local_720;
          uStack_638 = uStack_718;
          uStack_630 = uStack_710;
          uStack_628 = uStack_708;
          local_600 = local_780;
          uStack_5f8 = uStack_778;
          uStack_5f0 = uStack_770;
          uStack_5e8 = uStack_768;
          local_5c0 = local_7e0;
          uStack_5b8 = uStack_7d8;
          uStack_5b0 = uStack_7d0;
          uStack_5a8 = uStack_7c8;
          local_580 = local_840;
          uStack_578 = uStack_838;
          uStack_570 = uStack_830;
          uStack_568 = uStack_828;
          local_540 = local_8a0;
          uStack_538 = uStack_898;
          uStack_530 = uStack_890;
          uStack_528 = uStack_888;
          local_500 = local_c60;
          uStack_4f8 = uStack_c58;
          uStack_4f0 = uStack_c50;
          uStack_4e8 = uStack_c48;
          local_4e0 = local_b00;
          uStack_4d8 = uStack_af8;
          uStack_4d0 = uStack_af0;
          uStack_4c8 = uStack_ae8;
          local_4c0 = local_c40;
          uStack_4b8 = uStack_c38;
          uStack_4b0 = uStack_c30;
          uStack_4a8 = uStack_c28;
          local_4a0 = local_ae0;
          uStack_498 = uStack_ad8;
          uStack_490 = uStack_ad0;
          uStack_488 = uStack_ac8;
          local_480 = local_c20;
          uStack_478 = uStack_c18;
          uStack_470 = uStack_c10;
          uStack_468 = uStack_c08;
          local_460 = local_ac0;
          uStack_458 = uStack_ab8;
          uStack_450 = uStack_ab0;
          uStack_448 = uStack_aa8;
          local_440 = local_6e0;
          uStack_438 = uStack_6d8;
          uStack_430 = uStack_6d0;
          uStack_428 = uStack_6c8;
          fStack_404 = fStack_644;
          local_400 = local_740;
          uStack_3f8 = uStack_738;
          uStack_3f0 = uStack_730;
          uStack_3e8 = uStack_728;
          fStack_3c4 = fStack_604;
          local_3c0 = local_7a0;
          uStack_3b8 = uStack_798;
          uStack_3b0 = uStack_790;
          uStack_3a8 = uStack_788;
          fStack_384 = fStack_5c4;
          local_380 = local_800;
          uStack_378 = uStack_7f8;
          uStack_370 = uStack_7f0;
          uStack_368 = uStack_7e8;
          fStack_344 = fStack_584;
          local_340 = local_860;
          uStack_338 = uStack_858;
          uStack_330 = uStack_850;
          uStack_328 = uStack_848;
          fStack_304 = fStack_544;
          local_300 = local_8c0;
          uStack_2f8 = uStack_8b8;
          uStack_2f0 = uStack_8b0;
          uStack_2e8 = uStack_8a8;
          fStack_2c4 = fStack_504;
          local_270 = local_290;
          uStack_268 = uStack_288;
          local_1c0 = local_260._0_8_;
          uStack_1b8 = local_260._8_8_;
          local_1b0 = local_260._16_8_;
          uStack_1a8 = local_260._24_8_;
          local_17c = local_180;
          local_178 = local_180;
          local_174 = local_180;
          local_170 = local_180;
          local_16c = local_180;
          local_168 = local_180;
          local_164 = local_180;
          local_100 = local_cc0;
          uStack_f8 = uStack_cb8;
          uStack_f0 = uStack_cb0;
          uStack_e8 = uStack_ca8;
          local_e0 = local_ca0;
          uStack_d8 = uStack_c98;
          uStack_d0 = uStack_c90;
          uStack_c8 = uStack_c88;
          local_c0 = local_c80;
          uStack_b8 = uStack_c78;
          uStack_b0 = uStack_c70;
          uStack_a8 = uStack_c68;
          local_80 = local_290;
          uStack_78 = uStack_288;
          local_70 = local_290;
          uStack_68 = uStack_288;
          local_60 = fStack_29c;
          fStack_5c = fStack_29c;
          fStack_58 = fStack_29c;
          fStack_54 = fStack_29c;
          local_50 = ZEXT416((uint)local_50._0_4_);
        }
      }
      local_a00 = local_a00 + 0x48;
      Mat::~Mat((Mat *)0x331199);
    }
    Mat::~Mat((Mat *)0x3311bc);
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}